

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  byte bVar1;
  U32 UVar2;
  U32 UVar3;
  U32 local_2c;
  U32 local_24;
  U32 llCode;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  
  if (litLength < 0x20001) {
    if (optPtr->priceType == zop_predef) {
      if (optLevel == 0) {
        local_24 = ZSTD_bitWeight(litLength);
      }
      else {
        local_24 = ZSTD_fracWeight(litLength);
      }
      optPtr_local._4_4_ = local_24;
    }
    else if (litLength == 0x20000) {
      UVar2 = ZSTD_litLengthPrice(0x1ffff,optPtr,optLevel);
      optPtr_local._4_4_ = UVar2 + 0x100;
    }
    else {
      UVar3 = ZSTD_LLcode(litLength);
      bVar1 = ""[UVar3];
      UVar2 = optPtr->litLengthSumBasePrice;
      if (optLevel == 0) {
        local_2c = ZSTD_bitWeight(optPtr->litLengthFreq[UVar3]);
      }
      else {
        local_2c = ZSTD_fracWeight(optPtr->litLengthFreq[UVar3]);
      }
      optPtr_local._4_4_ = ((uint)bVar1 * 0x100 + UVar2) - local_2c;
    }
    return optPtr_local._4_4_;
  }
  __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x125,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}